

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::AssertionPortSymbol::AssertionPortSymbol
          (AssertionPortSymbol *this,string_view name,SourceLocation loc)

{
  bitmask<slang::ast::DeclaredTypeFlags> local_44;
  SourceLocation local_40;
  SourceLocation local_38;
  char *local_30;
  AssertionPortSymbol *local_28;
  AssertionPortSymbol *this_local;
  SourceLocation loc_local;
  string_view name_local;
  
  local_30 = name._M_str;
  local_38 = (SourceLocation)name._M_len;
  local_40 = loc;
  local_28 = this;
  this_local = (AssertionPortSymbol *)loc;
  loc_local = local_38;
  Symbol::Symbol(&this->super_Symbol,AssertionPort,name,loc);
  bitmask<slang::ast::DeclaredTypeFlags>::bitmask(&local_44,None);
  DeclaredType::DeclaredType(&this->declaredType,&this->super_Symbol,local_44);
  this->defaultValueSyntax = (PropertyExprSyntax *)0x0;
  std::optional<slang::ast::ArgumentDirection>::optional(&this->localVarDirection);
  return;
}

Assistant:

AssertionPortSymbol::AssertionPortSymbol(string_view name, SourceLocation loc) :
    Symbol(SymbolKind::AssertionPort, name, loc), declaredType(*this) {
}